

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (uint64_t *ints,size_t numInts,char *compressed,string *err)

{
  mapped_type *pmVar1;
  byte *pbVar2;
  char *input;
  size_t sVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  SInt val;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  counts;
  long local_90;
  string *local_88;
  ulong local_80;
  long *local_78;
  char *local_70;
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    input = (char *)operator_new__(0);
    sVar3 = LZ4Compression::CompressToBuffer(input,compressed,0,err);
    operator_delete__(input);
    return sVar3;
  }
  local_80 = numInts * 2 + 7 >> 3;
  local_88 = err;
  local_70 = compressed;
  local_78 = (long *)operator_new__(local_80 + numInts * 8 + 8);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar12 = 0;
  lVar11 = 0;
  uVar9 = 0;
  lVar14 = 0;
  do {
    local_90 = *(long *)((long)ints + lVar12) - lVar11;
    pmVar1 = ::std::__detail::
             _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_90);
    uVar6 = *pmVar1 + 1;
    *pmVar1 = uVar6;
    bVar16 = uVar6 == uVar9;
    lVar15 = local_90;
    if (((uVar6 <= uVar9) && (uVar6 = uVar9, lVar15 = lVar14, bVar16)) && (lVar14 < local_90)) {
      lVar15 = local_90;
    }
    lVar11 = *(long *)((long)ints + lVar12);
    lVar12 = lVar12 + 8;
    uVar9 = uVar6;
    lVar14 = lVar15;
  } while (numInts * 8 - lVar12 != 0);
  ::std::
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  *local_78 = lVar15;
  pbVar2 = (byte *)(local_78 + 1);
  plVar13 = (long *)((long)local_78 + local_80 + 8);
  if (3 < numInts) {
    uVar7 = 0;
    do {
      iVar5 = 0;
      bVar10 = 0;
      uVar8 = uVar7;
      do {
        uVar7 = *ints;
        lVar11 = uVar7 - uVar8;
        if (lVar11 != lVar15) {
          bVar4 = (byte)iVar5;
          if ((short)lVar11 == lVar11) {
            bVar4 = (byte)(1 << (bVar4 & 0x1f));
            *(short *)plVar13 = (short)lVar11;
            lVar11 = 2;
          }
          else if (lVar11 - 0x80000000U < 0xffffffff00000000) {
            bVar4 = (byte)(3 << (bVar4 & 0x1f));
            *plVar13 = lVar11;
            lVar11 = 8;
          }
          else {
            bVar4 = (byte)(2 << (bVar4 & 0x1f));
            *(int *)plVar13 = (int)lVar11;
            lVar11 = 4;
          }
          plVar13 = (long *)((long)plVar13 + lVar11);
          bVar10 = bVar10 | bVar4;
        }
        ints = ints + 1;
        iVar5 = iVar5 + 2;
        uVar8 = uVar7;
      } while (iVar5 != 8);
      *pbVar2 = bVar10;
      pbVar2 = pbVar2 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar3 = (*(code *)(&DAT_005e5c5c + *(int *)(&DAT_005e5c5c + numInts * 4)))();
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    uint64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}